

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O0

void __thiscall LogImpl::init_stream(LogImpl *this,string *name)

{
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>_>
  *this_00;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>_>
  __l;
  bool bVar1;
  byte bVar2;
  ostream *poVar3;
  pointer ppVar4;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>
  *local_120;
  _Self local_108;
  _Self local_100;
  const_iterator it;
  Stream local_f0 [5];
  Stream local_dc;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>
  *local_d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>
  local_d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>
  local_a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>
  local_80;
  iterator local_58;
  size_type local_50;
  undefined1 local_48 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>_>_>
  strmap;
  string *name_local;
  LogImpl *this_local;
  
  local_d8 = &local_d0;
  local_dc = None;
  strmap._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)name;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>
  ::pair<const_char_(&)[5],_LogImpl::Stream,_true>(local_d8,(char (*) [5])"none",&local_dc);
  local_d8 = &local_a8;
  local_f0[0] = StdOut;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>
  ::pair<const_char_(&)[7],_LogImpl::Stream,_true>(local_d8,(char (*) [7])"stdout",local_f0);
  local_d8 = &local_80;
  it._M_node._4_4_ = 1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>
  ::pair<const_char_(&)[7],_LogImpl::Stream,_true>
            (local_d8,(char (*) [7])"stderr",(Stream *)((long)&it._M_node + 4));
  local_58 = &local_d0;
  local_50 = 3;
  this_00 = (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>_>
             *)((long)&it._M_node + 2);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>_>
  ::allocator(this_00);
  __l._M_len = local_50;
  __l._M_array = local_58;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>_>_>
         *)local_48,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        ((long)&it._M_node + 3),this_00);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>_>
  ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>_>
                *)((long)&it._M_node + 2));
  local_120 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>
               *)&local_58;
  do {
    local_120 = local_120 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>
    ::~pair(local_120);
  } while (local_120 != &local_d0);
  local_100._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>_>_>
               *)local_48,(key_type *)strmap._M_t._M_impl.super__Rb_tree_header._M_node_count);
  local_108._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>_>_>
              *)local_48);
  bVar1 = std::operator==(&local_100,&local_108);
  if (bVar1) {
    this->m_stream = File;
    std::ofstream::open((string *)&this->m_ofstream,
                        (_Ios_Openmode)strmap._M_t._M_impl.super__Rb_tree_header._M_node_count);
    bVar2 = std::ios::operator!((ios *)(&this->m_ofstream +
                                       *(long *)(*(long *)&this->m_ofstream + -0x18)));
    if (((bVar2 & 1) != 0) && (0 < this->m_verbosity)) {
      poVar3 = std::operator<<((ostream *)&std::cerr,s_prefix);
      poVar3 = std::operator<<(poVar3,"Could not open log file ");
      poVar3 = std::operator<<(poVar3,(string *)
                                      strmap._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>_>
             ::operator->(&local_100);
    this->m_stream = ppVar4->second;
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>_>_>
          *)local_48);
  return;
}

Assistant:

void init_stream(const std::string& name)
    {
        const std::map<std::string, Stream> strmap { { "none", Stream::None },
                                           { "stdout", Stream::StdOut },
                                           { "stderr", Stream::StdErr } };

        auto it = strmap.find(name);

        if (it == strmap.end()) {
            m_stream = Stream::File;

            m_ofstream.open(name);

            if (!m_ofstream && m_verbosity > 0)
                std::cerr << s_prefix << "Could not open log file " << name << std::endl;
        } else
            m_stream = it->second;
    }